

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true,_true,_false>_>_>
::_reduce(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true,_true,_false>_>_>
          *this)

{
  pointer pIVar1;
  long lVar2;
  Index i;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0x28;
  for (uVar3 = 0; uVar3 < (this->reducedMatrixR_).nextInsertIndex_; uVar3 = uVar3 + 1) {
    pIVar1 = (this->reducedMatrixR_).matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true,_true,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)((long)&(pIVar1->super_Row_access_option).columnIndex_ + lVar4);
    if ((long)&(pIVar1->super_Row_access_option).columnIndex_ + lVar4 != lVar2 && lVar2 != 0) {
      _reduce_column(this,(Index)uVar3,(Index)uVar3);
    }
    lVar4 = lVar4 + 0x38;
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce()
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(reducedMatrixR_.get_number_of_columns());
  }

  for (Index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if (!(reducedMatrixR_.is_zero_column(i))) {
      _reduce_column(i, i);
    } else {
      _add_bar(get_column_dimension(i), i);
    }
  }
}